

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_TwoLevelShm.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP5Writer::WriteData_TwoLevelShm(BP5Writer *this,BufferV *Data)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  TokenChain<unsigned_long> *this_00;
  uint64_t uVar4;
  reference puVar5;
  unsigned_long *puVar6;
  BufferV *in_RSI;
  Comm *in_RDI;
  uint64_t nextWriterPos_3;
  uint64_t nextWriterPos;
  uint64_t nextWriterPos_2;
  uint64_t nextWriterPos_1;
  TokenChain<unsigned_long> tokenChain;
  size_t alignment_size;
  unsigned_long s;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  uint64_t maxSize;
  uint64_t myTotalSize;
  vector<unsigned_long,_std::allocator<unsigned_long>_> mySizes;
  MPIShmChain *a;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffd68;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffd70;
  _Head_base<0UL,_adios2::helper::CommImpl_*,_false> in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd98;
  allocator *paVar7;
  BP5Writer *in_stack_fffffffffffffda0;
  BufferV *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  BP5Writer *in_stack_fffffffffffffdf0;
  TokenChain<unsigned_long> *token;
  _Head_base<0UL,_adios2::helper::CommImpl_*,_false> this_01;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  unsigned_long *in_stack_fffffffffffffe80;
  Comm *in_stack_fffffffffffffe88;
  Comm *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffea0;
  allocator local_141;
  string local_140 [40];
  long local_118;
  allocator local_109;
  string local_108 [32];
  size_t in_stack_ffffffffffffff18;
  size_t in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffff28;
  MPIShmChain *in_stack_ffffffffffffff30;
  allocator local_b9;
  string local_b8 [64];
  ulong local_78;
  ulong local_60;
  unsigned_long *local_58;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_50;
  undefined1 *local_48;
  ulong local_40;
  long local_38;
  undefined1 local_30 [24];
  TokenChain<unsigned_long> *local_18;
  BufferV *local_10;
  
  this_01._M_head_impl =
       in_RDI[0x13b].m_Impl._M_t.
       super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
       ._M_t.
       super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
       .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
  local_10 = in_RSI;
  if (this_01._M_head_impl == (CommImpl *)0x0) {
    this_00 = (TokenChain<unsigned_long> *)0x0;
  }
  else {
    this_00 = (TokenChain<unsigned_long> *)
              __dynamic_cast(this_01._M_head_impl,&aggregator::MPIAggregator::typeinfo,
                             &aggregator::MPIShmChain::typeinfo,0);
  }
  local_18 = this_00;
  uVar4 = helper::PaddingToAlignOffset
                    ((uint64_t)
                     in_RDI[0x183].m_Impl._M_t.
                     super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                     .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl,
                     (ulong)*(uint *)((long)&in_RDI[0x34].m_Impl._M_t.
                                             super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                                             .
                                             super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>
                                             ._M_head_impl + 4));
  in_RDI[0x183].m_Impl._M_t.
  super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>.
  _M_t.
  super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
  .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl =
       ((CommImpl *)
       ((long)&(in_RDI[0x183].m_Impl._M_t.
                super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                ._M_t.
                super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl)->
               _vptr_CommImpl + uVar4))._M_head_impl;
  token = local_18 + 1;
  adios2::format::BufferV::Size(local_10);
  helper::Comm::GatherValues<unsigned_long>
            ((Comm *)in_stack_fffffffffffffda8,(unsigned_long)in_stack_fffffffffffffda0,
             (int)(in_stack_fffffffffffffd98 >> 0x20));
  local_38 = 0;
  local_40 = 0;
  local_48 = local_30;
  local_50._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_fffffffffffffd68);
  local_58 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       (in_stack_fffffffffffffd68);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_fffffffffffffd70,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffd68), bVar1) {
    puVar5 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_50);
    local_60 = *puVar5;
    local_38 = local_60 + local_38;
    if (local_40 < local_60) {
      local_40 = local_60;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_50);
  }
  iVar2 = helper::Comm::Size((Comm *)0xaa2482);
  if (1 < iVar2) {
    local_78 = 0x20;
    if ((*(byte *)&in_RDI[0x35].m_Impl._M_t.
                   super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                   .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl & 1) != 0)
    {
      local_78 = (ulong)*(uint *)((long)&in_RDI[0x35].m_Impl._M_t.
                                         super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                                         .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>.
                                         _M_head_impl + 4);
    }
    aggregator::MPIShmChain::CreateShm
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff18);
  }
  shm::TokenChain<unsigned_long>::TokenChain
            ((TokenChain<unsigned_long> *)this_01._M_head_impl,in_RDI);
  if ((*(byte *)&local_18[1].m_Win.m_Impl._M_t.
                 super___uniq_ptr_impl<adios2::helper::CommWinImpl,_std::default_delete<adios2::helper::CommWinImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_adios2::helper::CommWinImpl_*,_std::default_delete<adios2::helper::CommWinImpl>_>
                 .super__Head_base<0UL,_adios2::helper::CommWinImpl_*,_false>._M_head_impl & 1) == 0
     ) {
    puVar6 = shm::TokenChain<unsigned_long>::RecvToken
                       ((TokenChain<unsigned_long> *)in_stack_fffffffffffffd80._M_head_impl);
    in_RDI[0x182].m_Impl._M_t.
    super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>.
    _M_t.
    super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
    .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl = (CommImpl *)*puVar6;
    SendDataToAggregator
              (in_stack_fffffffffffffdf0,
               (BufferV *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    in_stack_fffffffffffffd80._M_head_impl =
         in_RDI[0x182].m_Impl._M_t.
         super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
    adios2::format::BufferV::Size(local_10);
    shm::TokenChain<unsigned_long>::SendToken(this_00,(unsigned_long *)token);
  }
  else {
    iVar2 = helper::Comm::Rank((Comm *)0xaa2553);
    if (0 < iVar2) {
      helper::Comm::Rank((Comm *)0xaa259b);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b8,"AggregatorChain token in BP5Writer::WriteData_TwoLevelShm",&local_b9);
      helper::Comm::Recv<unsigned_long>
                (in_stack_fffffffffffffe90,(unsigned_long *)in_stack_fffffffffffffe88,
                 (size_t)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                 in_stack_fffffffffffffe78,in_stack_fffffffffffffea0);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      uVar4 = helper::PaddingToAlignOffset
                        ((uint64_t)
                         in_RDI[0x183].m_Impl._M_t.
                         super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                         .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl,
                         (ulong)*(uint *)((long)&in_RDI[0x34].m_Impl._M_t.
                                                 super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                                                 .
                                                 super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>
                                                 ._M_head_impl + 4));
      in_RDI[0x183].m_Impl._M_t.
      super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
      .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl =
           ((CommImpl *)
           ((long)&(in_RDI[0x183].m_Impl._M_t.
                    super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                    .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl)->
                   _vptr_CommImpl + uVar4))._M_head_impl;
    }
    in_RDI[0x182].m_Impl._M_t.
    super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>.
    _M_t.
    super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
    .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl =
         in_RDI[0x183].m_Impl._M_t.
         super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
         .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl;
    iVar2 = helper::Comm::Rank((Comm *)0xaa270d);
    iVar3 = helper::Comm::Size((Comm *)0xaa2727);
    if (iVar2 < iVar3 + -1) {
      helper::Comm::Rank((Comm *)0xaa2784);
      paVar7 = &local_109;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"Chain token in BP5Writer::WriteData",paVar7);
      helper::Comm::Isend<unsigned_long>
                (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                 in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,in_stack_fffffffffffffea0);
      helper::Comm::Req::~Req((Req *)0xaa281a);
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
    }
    else {
      iVar2 = helper::Comm::Size((Comm *)0xaa2893);
      if (1 < iVar2) {
        local_118 = (long)&(in_RDI[0x183].m_Impl._M_t.
                            super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                            .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl)
                           ->_vptr_CommImpl + local_38;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_140,"Chain token in BP5Writer::WriteData",&local_141);
        helper::Comm::Isend<unsigned_long>
                  (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                   in_stack_fffffffffffffe74,in_stack_fffffffffffffe70,in_stack_fffffffffffffea0);
        helper::Comm::Req::~Req((Req *)0xaa294e);
        std::__cxx11::string::~string(local_140);
        std::allocator<char>::~allocator((allocator<char> *)&local_141);
      }
    }
    adios2::format::BufferV::Size(local_10);
    shm::TokenChain<unsigned_long>::SendToken(this_00,(unsigned_long *)token);
    WriteMyOwnData((BP5Writer *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   in_stack_fffffffffffffda8);
    iVar2 = helper::Comm::Size((Comm *)0xaa2a28);
    if (1 < iVar2) {
      adios2::format::BufferV::Size(local_10);
      WriteOthersData(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    }
    iVar2 = helper::Comm::Size((Comm *)0xaa2a7b);
    if ((1 < iVar2) && (iVar2 = helper::Comm::Rank((Comm *)0xaa2a9f), iVar2 == 0)) {
      in_stack_fffffffffffffdb4 = helper::Comm::Size((Comm *)0xaa2adb);
      paVar7 = (allocator *)&stack0xfffffffffffffe8f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xfffffffffffffe90,"Chain token in BP5Writer::WriteData",paVar7);
      helper::Comm::Recv<unsigned_long>
                (in_stack_fffffffffffffe90,(unsigned_long *)in_stack_fffffffffffffe88,
                 (size_t)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                 in_stack_fffffffffffffe78,in_stack_fffffffffffffea0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe8f);
    }
  }
  iVar2 = helper::Comm::Size((Comm *)0xaa2c4e);
  if (1 < iVar2) {
    aggregator::MPIShmChain::DestroyShm
              ((MPIShmChain *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  }
  shm::TokenChain<unsigned_long>::~TokenChain
            ((TokenChain<unsigned_long> *)
             CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             in_stack_fffffffffffffd80._M_head_impl);
  return;
}

Assistant:

void BP5Writer::WriteData_TwoLevelShm(format::BufferV *Data)
{
    aggregator::MPIShmChain *a = dynamic_cast<aggregator::MPIShmChain *>(m_Aggregator);

    // new step writing starts at offset m_DataPos on master aggregator
    // other aggregators to the same file will need to wait for the position
    // to arrive from the rank below

    // align to PAGE_SIZE (only valid on master aggregator at this point)
    m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);

    // Each aggregator needs to know the total size they write
    // This calculation is valid on aggregators only
    std::vector<uint64_t> mySizes = a->m_Comm.GatherValues(Data->Size());
    uint64_t myTotalSize = 0;
    uint64_t maxSize = 0;
    for (auto s : mySizes)
    {
        myTotalSize += s;
        if (s > maxSize)
        {
            maxSize = s;
        }
    }

    if (a->m_Comm.Size() > 1)
    {
        size_t alignment_size = sizeof(max_align_t);
        if (m_Parameters.DirectIO)
        {
            alignment_size = m_Parameters.DirectIOAlignOffset;
        }
        a->CreateShm(static_cast<size_t>(maxSize), m_Parameters.MaxShmSize, alignment_size);
    }

    shm::TokenChain<uint64_t> tokenChain(&a->m_Comm);

    if (a->m_IsAggregator)
    {
        // In each aggregator chain, send from master down the line
        // these total sizes, so every aggregator knows where to start
        if (a->m_AggregatorChainComm.Rank() > 0)
        {
            a->m_AggregatorChainComm.Recv(
                &m_DataPos, 1, a->m_AggregatorChainComm.Rank() - 1, 0,
                "AggregatorChain token in BP5Writer::WriteData_TwoLevelShm");
            // align to PAGE_SIZE
            m_DataPos += helper::PaddingToAlignOffset(m_DataPos, m_Parameters.StripeSize);
        }
        m_StartDataPos = m_DataPos; // metadata needs this info
        if (a->m_AggregatorChainComm.Rank() < a->m_AggregatorChainComm.Size() - 1)
        {
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, a->m_AggregatorChainComm.Rank() + 1,
                                           0, "Chain token in BP5Writer::WriteData");
        }
        else if (a->m_AggregatorChainComm.Size() > 1)
        {
            // send back final position from last aggregator in file to master
            // aggregator
            uint64_t nextWriterPos = m_DataPos + myTotalSize;
            a->m_AggregatorChainComm.Isend(&nextWriterPos, 1, 0, 0,
                                           "Chain token in BP5Writer::WriteData");
        }

        /*std::cout << "Rank " << m_Comm.Rank()
                  << " aggregator start writing step " << m_WriterStep
                  << " to subfile " << a->m_SubStreamIndex << " at pos "
                  << m_DataPos << " totalsize " << myTotalSize << std::endl;*/

        // Send token to first non-aggregator to start filling shm
        // Also informs next process its starting offset (for correct metadata)
        uint64_t nextWriterPos = m_DataPos + Data->Size();
        tokenChain.SendToken(nextWriterPos);

        WriteMyOwnData(Data);

        /* Write from shm until every non-aggr sent all data */
        if (a->m_Comm.Size() > 1)
        {
            WriteOthersData(myTotalSize - Data->Size());
        }

        // Master aggregator needs to know where the last writing ended by the
        // last aggregator in the chain, so that it can start from the correct
        // position at the next output step
        if (a->m_AggregatorChainComm.Size() > 1 && !a->m_AggregatorChainComm.Rank())
        {
            a->m_AggregatorChainComm.Recv(&m_DataPos, 1, a->m_AggregatorChainComm.Size() - 1, 0,
                                          "Chain token in BP5Writer::WriteData");
        }
    }
    else
    {
        // non-aggregators fill shared buffer in marching order
        // they also receive their starting offset this way
        m_StartDataPos = tokenChain.RecvToken();

        /*std::cout << "Rank " << m_Comm.Rank()
                  << " non-aggregator recv token to fill shm = "
                  << m_StartDataPos << std::endl;*/

        SendDataToAggregator(Data);

        uint64_t nextWriterPos = m_StartDataPos + Data->Size();
        tokenChain.SendToken(nextWriterPos);
    }

    if (a->m_Comm.Size() > 1)
    {
        a->DestroyShm();
    }
}